

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PushItemFlag(ImGuiItemFlags option,bool enabled)

{
  uint uVar1;
  ImGuiContext *pIVar2;
  undefined7 in_register_00000031;
  int local_4;
  
  pIVar2 = GImGui;
  uVar1 = GImGui->CurrentItemFlags | option;
  if ((int)CONCAT71(in_register_00000031,enabled) == 0) {
    uVar1 = ~option & GImGui->CurrentItemFlags;
  }
  GImGui->CurrentItemFlags = uVar1;
  ImVector<int>::push_back(&pIVar2->ItemFlagsStack,&local_4);
  return;
}

Assistant:

void ImGui::PushItemFlag(ImGuiItemFlags option, bool enabled)
{
    ImGuiContext& g = *GImGui;
    ImGuiItemFlags item_flags = g.CurrentItemFlags;
    IM_ASSERT(item_flags == g.ItemFlagsStack.back());
    if (enabled)
        item_flags |= option;
    else
        item_flags &= ~option;
    g.CurrentItemFlags = item_flags;
    g.ItemFlagsStack.push_back(item_flags);
}